

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O1

void kmp_set_blocktime(int arg)

{
  int iVar1;
  
  iVar1 = __kmp_get_global_thread_id_reg();
  __kmp_aux_set_blocktime(arg,__kmp_threads[iVar1],*(int *)(__kmp_threads[iVar1]->th_pad + 0x20));
  return;
}

Assistant:

void FTN_STDCALL
FTN_SET_BLOCKTIME( int KMP_DEREF arg )
{
    #ifdef KMP_STUB
        __kmps_set_blocktime( KMP_DEREF arg );
    #else
	int gtid, tid;
	kmp_info_t *thread;

	gtid = __kmp_entry_gtid();
	tid = __kmp_tid_from_gtid(gtid);
	thread = __kmp_thread_from_gtid(gtid);

        __kmp_aux_set_blocktime( KMP_DEREF arg, thread, tid );
    #endif
}